

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O3

void __thiscall
ArgumentParser::Instance::Bind
          (Instance *this,
          MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *val)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.cxx:106:5)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.cxx:106:5)>
             ::_M_manager;
  local_38._M_unused._M_object = val;
  std::function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>::
  operator=(&this->KeywordValueFunc,
            (function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>)>
             *)&local_38);
  this->KeywordValuesExpected = 0;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void Instance::Bind(MaybeEmpty<std::vector<std::string>>& val)
{
  this->Bind(
    [&val](cm::string_view arg) -> Continue {
      val.emplace_back(arg);
      return Continue::Yes;
    },
    ExpectAtLeast{ 0 });
}